

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

bool match_one_ph(Am_Value *target_value,Am_Value *current_value)

{
  bool bVar1;
  char *pcVar2;
  Am_Object AStack_28;
  Am_Object local_20;
  
  if (target_value->type == 0xa001) {
    Am_Object::Am_Object(&local_20,target_value);
    Am_Object::Am_Object(&AStack_28,&Am_A_Placeholder);
    bVar1 = Am_Object::Is_Instance_Of(&local_20,&AStack_28);
    Am_Object::~Am_Object(&AStack_28);
    Am_Object::~Am_Object(&local_20);
    if (bVar1) {
      bVar1 = match_place_holder(target_value,current_value);
      if (bVar1) {
        return true;
      }
      pcVar2 = "  Placeholder Doesn\'t match\n";
      goto LAB_0020868e;
    }
  }
  bVar1 = Am_Value::operator!=(target_value,current_value);
  if (!bVar1) {
    return true;
  }
  pcVar2 = "  Doesn\'t match\n";
LAB_0020868e:
  std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool
match_one_ph(Am_Value &target_value, Am_Value &current_value)
{
  if (target_value.type == Am_OBJECT &&
      Am_Object(target_value).Is_Instance_Of(Am_A_Placeholder)) {
    if (!match_place_holder(target_value, current_value)) {
      std::cout << "  Placeholder Doesn't match\n" << std::flush;
      return false; // doesn't match
    }
  } else if (target_value != current_value) {
    std::cout << "  Doesn't match\n" << std::flush;
    return false; // doesn't match
  }
  return true;
}